

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

int pospopcnt_u16_sse_sad(uint16_t *data,uint32_t len,uint32_t *flag_counts)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int *in_RDX;
  uint in_ESI;
  undefined1 (*in_RDI) [16];
  __m128i counter_54DC;
  __m128i counter_32BA;
  __m128i counter_76FE;
  __m128i counter_1098;
  __m128i r7;
  __m128i r6;
  __m128i r5;
  __m128i r4;
  __m128i r3;
  __m128i r2;
  __m128i r1;
  __m128i r0;
  uint16_t *end;
  __m128i counterD;
  __m128i counterC;
  __m128i counterB;
  __m128i counterA;
  uint32_t buffer [16];
  __m128i mask_bits_b;
  __m128i mask_bits_a;
  __m128i mask_lo_cnt;
  __m128i mask_lo_byte;
  __m128i zero;
  ulong local_f40;
  ulong local_f38;
  uint local_f30;
  int local_f2c;
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined1 local_e18 [16];
  undefined1 local_e08 [16];
  undefined1 local_df8 [16];
  undefined1 local_de8 [16];
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined1 (*local_d30) [16];
  uint64_t x;
  uint64_t magic;
  uint64_t mask_01;
  uint64_t countsB;
  uint64_t countsA;
  int tail;
  int i;
  __m128i counter_BA98;
  __m128i counter_3210;
  __m128i counter_FEDC;
  __m128i counter_7654;
  
  auVar5 = vpcmpeqb_avx(ZEXT816(0),ZEXT816(0));
  auVar7 = vpsrlw_avx(auVar5,ZEXT416(8));
  auVar8 = vpsrlw_avx(auVar7,ZEXT416(2));
  auVar5 = vpinsrb_avx(ZEXT116(0x41),0x41,1);
  auVar5 = vpinsrb_avx(auVar5,0x41,2);
  auVar5 = vpinsrb_avx(auVar5,0x41,3);
  auVar5 = vpinsrb_avx(auVar5,0x41,4);
  auVar5 = vpinsrb_avx(auVar5,0x41,5);
  auVar5 = vpinsrb_avx(auVar5,0x41,6);
  auVar5 = vpinsrb_avx(auVar5,0x41,7);
  auVar5 = vpinsrb_avx(auVar5,0x41,8);
  auVar5 = vpinsrb_avx(auVar5,0x41,9);
  auVar5 = vpinsrb_avx(auVar5,0x41,10);
  auVar5 = vpinsrb_avx(auVar5,0x41,0xb);
  auVar5 = vpinsrb_avx(auVar5,0x41,0xc);
  auVar5 = vpinsrb_avx(auVar5,0x41,0xd);
  auVar5 = vpinsrb_avx(auVar5,0x41,0xe);
  auVar6 = vpinsrb_avx(auVar5,0x41,0xf);
  auVar5 = vpaddb_avx(auVar6,auVar6);
  local_de8 = ZEXT816(0);
  local_df8 = ZEXT816(0);
  local_e08 = ZEXT816(0);
  local_e18 = ZEXT816(0);
  for (local_d30 = in_RDI;
      local_d30 != (undefined1 (*) [16])(*in_RDI + (ulong)(in_ESI & 0xffffffe0) * 2);
      local_d30 = local_d30 + 4) {
    auVar1 = vpand_avx(auVar7,*local_d30);
    auVar2 = vpand_avx(auVar7,local_d30[1]);
    auVar3 = vpand_avx(auVar7,local_d30[2]);
    auVar4 = vpand_avx(auVar7,local_d30[3]);
    auVar9 = vpsrlw_avx(*local_d30,ZEXT416(8));
    auVar10 = vpsrlw_avx(local_d30[1],ZEXT416(8));
    auVar11 = vpsrlw_avx(local_d30[2],ZEXT416(8));
    auVar12 = vpsrlw_avx(local_d30[3],ZEXT416(8));
    auVar9 = vpackuswb_avx(auVar9,auVar1);
    auVar2 = vpackuswb_avx(auVar10,auVar2);
    auVar3 = vpackuswb_avx(auVar11,auVar3);
    auVar4 = vpackuswb_avx(auVar12,auVar4);
    auVar1 = vpand_avx(auVar6,auVar9);
    auVar10 = vpand_avx(auVar6,auVar2);
    auVar11 = vpand_avx(auVar6,auVar3);
    auVar12 = vpand_avx(auVar6,auVar4);
    auVar1 = vpsadbw_avx(auVar1,ZEXT816(0));
    auVar10 = vpsadbw_avx(auVar10,ZEXT816(0));
    auVar11 = vpsadbw_avx(auVar11,ZEXT816(0));
    auVar12 = vpsadbw_avx(auVar12,ZEXT816(0));
    auVar1 = vpaddw_avx(auVar1,auVar10);
    auVar1 = vpaddw_avx(auVar1,auVar11);
    auVar1 = vpaddw_avx(auVar1,auVar12);
    auVar10 = vpand_avx(auVar8,auVar1);
    auVar1 = vpsrlw_avx(auVar1,ZEXT416(6));
    auVar1 = vpackssdw_avx(auVar1,auVar10);
    local_de8 = vpaddd_avx(local_de8,auVar1);
    auVar1 = vpand_avx(auVar5,auVar9);
    auVar10 = vpand_avx(auVar5,auVar2);
    auVar11 = vpand_avx(auVar5,auVar3);
    auVar12 = vpand_avx(auVar5,auVar4);
    auVar1 = vpsadbw_avx(auVar1,ZEXT816(0));
    auVar10 = vpsadbw_avx(auVar10,ZEXT816(0));
    auVar11 = vpsadbw_avx(auVar11,ZEXT816(0));
    auVar12 = vpsadbw_avx(auVar12,ZEXT816(0));
    auVar1 = vpaddw_avx(auVar1,auVar10);
    auVar1 = vpaddw_avx(auVar1,auVar11);
    auVar1 = vpaddw_avx(auVar1,auVar12);
    auVar10 = vpavgb_avx(ZEXT816(0),auVar1);
    auVar10 = vpand_avx(auVar10,auVar8);
    auVar1 = vpsrlw_avx(auVar1,ZEXT416(7));
    auVar1 = vpackssdw_avx(auVar1,auVar10);
    local_df8 = vpaddd_avx(local_df8,auVar1);
    auVar1 = vpsllw_avx(auVar9,ZEXT416(0xc));
    auVar10 = vpsllw_avx(auVar2,ZEXT416(0xc));
    auVar11 = vpsllw_avx(auVar3,ZEXT416(0xc));
    auVar12 = vpsllw_avx(auVar4,ZEXT416(0xc));
    auVar9 = vpsrlw_avx(auVar9,ZEXT416(4));
    auVar2 = vpsrlw_avx(auVar2,ZEXT416(4));
    auVar3 = vpsrlw_avx(auVar3,ZEXT416(4));
    auVar13 = vpsrlw_avx(auVar4,ZEXT416(4));
    auVar4 = vpor_avx(auVar9,auVar1);
    auVar10 = vpor_avx(auVar2,auVar10);
    auVar11 = vpor_avx(auVar3,auVar11);
    auVar12 = vpor_avx(auVar13,auVar12);
    auVar1 = vpand_avx(auVar6,auVar4);
    auVar9 = vpand_avx(auVar6,auVar10);
    auVar2 = vpand_avx(auVar6,auVar11);
    auVar3 = vpand_avx(auVar6,auVar12);
    auVar1 = vpsadbw_avx(auVar1,ZEXT816(0));
    auVar9 = vpsadbw_avx(auVar9,ZEXT816(0));
    auVar2 = vpsadbw_avx(auVar2,ZEXT816(0));
    auVar3 = vpsadbw_avx(auVar3,ZEXT816(0));
    auVar1 = vpaddw_avx(auVar1,auVar9);
    auVar1 = vpaddw_avx(auVar1,auVar2);
    auVar1 = vpaddw_avx(auVar1,auVar3);
    auVar9 = vpand_avx(auVar8,auVar1);
    auVar1 = vpsrlw_avx(auVar1,ZEXT416(6));
    auVar1 = vpackssdw_avx(auVar1,auVar9);
    local_e08 = vpaddd_avx(local_e08,auVar1);
    auVar1 = vpand_avx(auVar4,auVar5);
    auVar9 = vpand_avx(auVar10,auVar5);
    auVar2 = vpand_avx(auVar11,auVar5);
    auVar3 = vpand_avx(auVar12,auVar5);
    auVar1 = vpsadbw_avx(auVar1,ZEXT816(0));
    auVar9 = vpsadbw_avx(auVar9,ZEXT816(0));
    auVar2 = vpsadbw_avx(auVar2,ZEXT816(0));
    auVar3 = vpsadbw_avx(auVar3,ZEXT816(0));
    auVar1 = vpaddw_avx(auVar1,auVar9);
    auVar1 = vpaddw_avx(auVar1,auVar2);
    auVar1 = vpaddw_avx(auVar1,auVar3);
    auVar9 = vpavgb_avx(ZEXT816(0),auVar1);
    auVar9 = vpand_avx(auVar9,auVar8);
    auVar1 = vpsrlw_avx(auVar1,ZEXT416(7));
    auVar1 = vpackssdw_avx(auVar1,auVar9);
    local_e18 = vpaddd_avx(local_e18,auVar1);
  }
  auVar5 = vpunpckhdq_avx(local_de8,local_df8);
  auVar8 = vpunpckldq_avx(local_de8,local_df8);
  auVar1 = vpunpckldq_avx(local_e08,local_e18);
  auVar6 = vpunpckhdq_avx(local_e08,local_e18);
  auVar7 = vpunpckhqdq_avx(auVar6,auVar8);
  auVar8 = vpunpcklqdq_avx(auVar6,auVar8);
  auVar6 = vpunpckhqdq_avx(auVar5,auVar1);
  auVar5 = vpunpcklqdq_avx(auVar5,auVar1);
  local_f18 = auVar6._0_8_;
  uStack_f10 = auVar6._8_8_;
  local_dd8 = local_f18;
  uStack_dd0 = uStack_f10;
  local_ef8 = auVar7._0_8_;
  uStack_ef0 = auVar7._8_8_;
  local_dc8 = local_ef8;
  uStack_dc0 = uStack_ef0;
  local_f28 = auVar5._0_8_;
  uStack_f20 = auVar5._8_8_;
  local_db8 = local_f28;
  uStack_db0 = uStack_f20;
  local_f08 = auVar8._0_8_;
  uStack_f00 = auVar8._8_8_;
  local_da8 = local_f08;
  uStack_da0 = uStack_f00;
  for (local_f2c = 0; local_f2c < 0x10; local_f2c = local_f2c + 1) {
    in_RDX[local_f2c] = *(int *)((long)&local_dd8 + (long)local_f2c * 4) + in_RDX[local_f2c];
  }
  local_f30 = in_ESI & 0x1f;
  if (local_f30 != 0) {
    local_f38 = 0;
    local_f40 = 0;
    do {
      local_f38 = (((ulong)*(ushort *)*local_d30 & 0x5555) * 0x40010004001 & 0x101010101010101) +
                  local_f38;
      local_f40 = (((ulong)(*(ushort *)*local_d30 >> 1) & 0x5555) * 0x40010004001 &
                  0x101010101010101) + local_f40;
      local_f30 = local_f30 - 1;
      local_d30 = (undefined1 (*) [16])(*local_d30 + 2);
    } while (local_f30 != 0);
    *in_RDX = *in_RDX + (int)(local_f38 & 0xff000000ff);
    in_RDX[8] = in_RDX[8] + ((uint)(local_f38 >> 8) & 0xff);
    in_RDX[2] = in_RDX[2] + ((uint)(local_f38 >> 0x10) & 0xff);
    in_RDX[10] = in_RDX[10] + ((uint)(local_f38 >> 0x18) & 0xff);
    in_RDX[4] = in_RDX[4] + (int)((local_f38 & 0xff000000ff) >> 0x20);
    in_RDX[0xc] = in_RDX[0xc] + ((uint)(local_f38 >> 0x28) & 0xff);
    in_RDX[6] = in_RDX[6] + ((ushort)(local_f38 >> 0x30) & 0xff);
    in_RDX[0xe] = in_RDX[0xe] + (uint)(byte)(local_f38 >> 0x38);
    in_RDX[1] = in_RDX[1] + (int)(local_f40 & 0xff000000ff);
    in_RDX[9] = in_RDX[9] + ((uint)(local_f40 >> 8) & 0xff);
    in_RDX[3] = in_RDX[3] + ((uint)(local_f40 >> 0x10) & 0xff);
    in_RDX[0xb] = in_RDX[0xb] + ((uint)(local_f40 >> 0x18) & 0xff);
    in_RDX[5] = in_RDX[5] + (int)((local_f40 & 0xff000000ff) >> 0x20);
    in_RDX[0xd] = in_RDX[0xd] + ((uint)(local_f40 >> 0x28) & 0xff);
    in_RDX[7] = in_RDX[7] + ((ushort)(local_f40 >> 0x30) & 0xff);
    in_RDX[0xf] = in_RDX[0xf] + (uint)(byte)(local_f40 >> 0x38);
  }
  return 0;
}

Assistant:

int pospopcnt_u16_sse_sad(const uint16_t* data, uint32_t len, uint32_t* flag_counts) {
    const __m128i zero = _mm_setzero_si128();
    const __m128i mask_lo_byte = _mm_srli_epi16(_mm_cmpeq_epi8(zero, zero), 8);
    const __m128i mask_lo_cnt  = _mm_srli_epi16(mask_lo_byte, 2);
    const __m128i mask_bits_a  = _mm_set1_epi8(0x41); // 01000001
    const __m128i mask_bits_b  = _mm_add_epi8(mask_bits_a, mask_bits_a);
    uint32_t buffer[16];

    __m128i counterA = zero;
    __m128i counterB = zero;
    __m128i counterC = zero;
    __m128i counterD = zero;

    for (const uint16_t* end = &data[(len & ~31)]; data != end; data += 32) {
        __m128i r0 = _mm_loadu_si128((__m128i*)&data[0]);
        __m128i r1 = _mm_loadu_si128((__m128i*)&data[8]);
        __m128i r2 = _mm_loadu_si128((__m128i*)&data[16]);
        __m128i r3 = _mm_loadu_si128((__m128i*)&data[24]);
        __m128i r4, r5, r6, r7;

        // seperate LOBYTE and HIBYTE of each WORD
        // (emulate PSHUFB F,D,B,9,7,5,3,1, E,C,A,8,6,4,2,0)
        r4 = _mm_and_si128(mask_lo_byte, r0);
        r5 = _mm_and_si128(mask_lo_byte, r1);
        r6 = _mm_and_si128(mask_lo_byte, r2);
        r7 = _mm_and_si128(mask_lo_byte, r3);
        r0 = _mm_srli_epi16(r0, 8);
        r1 = _mm_srli_epi16(r1, 8);
        r2 = _mm_srli_epi16(r2, 8);
        r3 = _mm_srli_epi16(r3, 8);
        r0 = _mm_packus_epi16(r0, r4);
        r1 = _mm_packus_epi16(r1, r5);
        r2 = _mm_packus_epi16(r2, r6);
        r3 = _mm_packus_epi16(r3, r7);

        // isolate bits to count
        r4 = _mm_and_si128(mask_bits_a, r0);
        r5 = _mm_and_si128(mask_bits_a, r1);
        r6 = _mm_and_si128(mask_bits_a, r2);
        r7 = _mm_and_si128(mask_bits_a, r3);

        // horizontal sum of qwords
        r4 = _mm_sad_epu8(r4, zero);
        r5 = _mm_sad_epu8(r5, zero);
        r6 = _mm_sad_epu8(r6, zero);
        r7 = _mm_sad_epu8(r7, zero);

        // sum 6-bit counts
        r4 = _mm_add_epi16(r4,r5);
        r4 = _mm_add_epi16(r4,r6);
        r4 = _mm_add_epi16(r4,r7);

        // unpack 6-bit counts to 32-bits
        r5 = _mm_and_si128(mask_lo_cnt, r4);
        r4 = _mm_srli_epi16(r4, 6);
        r4 = _mm_packs_epi32(r4, r5);

        // accumulate
        counterA = _mm_add_epi32(counterA, r4);

        // do it again...
        r4 = _mm_and_si128(mask_bits_b, r0);
        r5 = _mm_and_si128(mask_bits_b, r1);
        r6 = _mm_and_si128(mask_bits_b, r2);
        r7 = _mm_and_si128(mask_bits_b, r3);

        r4 = _mm_sad_epu8(r4, zero);
        r5 = _mm_sad_epu8(r5, zero);
        r6 = _mm_sad_epu8(r6, zero);
        r7 = _mm_sad_epu8(r7, zero);

        r4 = _mm_add_epi16(r4,r5);
        r4 = _mm_add_epi16(r4,r6);
        r4 = _mm_add_epi16(r4,r7);

        r5 = _mm_avg_epu8(zero, r4); // shift right 1
        r5 = _mm_and_si128(r5, mask_lo_cnt);
        r4 = _mm_srli_epi16(r4, 7);
        r4 = _mm_packs_epi32(r4, r5);

        counterB = _mm_add_epi32(counterB, r4); // accumulate

        // rotate right 4
        r4 = _mm_slli_epi16(r0, 12);
        r5 = _mm_slli_epi16(r1, 12);
        r6 = _mm_slli_epi16(r2, 12);
        r7 = _mm_slli_epi16(r3, 12);
        r0 = _mm_srli_epi16(r0, 4);
        r1 = _mm_srli_epi16(r1, 4);
        r2 = _mm_srli_epi16(r2, 4);
        r3 = _mm_srli_epi16(r3, 4);
        r0 = _mm_or_si128(r0, r4);
        r1 = _mm_or_si128(r1, r5);
        r2 = _mm_or_si128(r2, r6);
        r3 = _mm_or_si128(r3, r7);

        // do it again...
        r4 = _mm_and_si128(mask_bits_a, r0);
        r5 = _mm_and_si128(mask_bits_a, r1);
        r6 = _mm_and_si128(mask_bits_a, r2);
        r7 = _mm_and_si128(mask_bits_a, r3);

        r4 = _mm_sad_epu8(r4, zero);
        r5 = _mm_sad_epu8(r5, zero);
        r6 = _mm_sad_epu8(r6, zero);
        r7 = _mm_sad_epu8(r7, zero);

        r4 = _mm_add_epi16(r4,r5);
        r4 = _mm_add_epi16(r4,r6);
        r4 = _mm_add_epi16(r4,r7);

        r5 = _mm_and_si128(mask_lo_cnt, r4);
        r4 = _mm_srli_epi16(r4, 6);
        r4 = _mm_packs_epi32(r4, r5);

        counterC = _mm_add_epi32(counterC, r4); // accumulate

        // do it again...
        r0 = _mm_and_si128(r0, mask_bits_b);
        r1 = _mm_and_si128(r1, mask_bits_b);
        r2 = _mm_and_si128(r2, mask_bits_b);
        r3 = _mm_and_si128(r3, mask_bits_b);

        r0 = _mm_sad_epu8(r0, zero);
        r1 = _mm_sad_epu8(r1, zero);
        r2 = _mm_sad_epu8(r2, zero);
        r3 = _mm_sad_epu8(r3, zero);

        r0 = _mm_add_epi16(r0,r1);
        r0 = _mm_add_epi16(r0,r2);
        r0 = _mm_add_epi16(r0,r3);

        r1 = _mm_avg_epu8(zero, r0);
        r1 = _mm_and_si128(r1, mask_lo_cnt);
        r0 = _mm_srli_epi16(r0, 7);
        r0 = _mm_packs_epi32(r0, r1);

        counterD = _mm_add_epi32(counterD, r0); // accumulate
    }

    // transpose then store counters
    __m128i counter_1098 = _mm_unpackhi_epi32(counterA, counterB);
    __m128i counter_76FE = _mm_unpacklo_epi32(counterA, counterB);
    __m128i counter_32BA = _mm_unpacklo_epi32(counterC, counterD);
    __m128i counter_54DC = _mm_unpackhi_epi32(counterC, counterD);
    __m128i counter_7654 = _mm_unpackhi_epi64(counter_54DC, counter_76FE);
    __m128i counter_FEDC = _mm_unpacklo_epi64(counter_54DC, counter_76FE);
    __m128i counter_3210 = _mm_unpackhi_epi64(counter_1098, counter_32BA);
    __m128i counter_BA98 = _mm_unpacklo_epi64(counter_1098, counter_32BA);

    
    _mm_storeu_si128((__m128i*)&buffer[0], counter_3210);
    _mm_storeu_si128((__m128i*)&buffer[4], counter_7654);
    _mm_storeu_si128((__m128i*)&buffer[8], counter_BA98);
    _mm_storeu_si128((__m128i*)&buffer[12], counter_FEDC);
    for (int i = 0; i < 16; ++i) flag_counts[i] += buffer[i];

    // scalar tail loop
    int tail = len & 31;
    if (tail != 0) {
        uint64_t countsA = 0;
        uint64_t countsB = 0;
        do {
            // zero-extend a bit to 8-bits then accumulate
            // (emulate pdep)
            const uint64_t mask_01 = UINT64_C(0x0101010101010101);// 100000001000000010000000100000001000000010000000100000001
            const uint64_t magic   = UINT64_C(0x0000040010004001);// 000000000000001000000000000010000000000000100000000000001
                                                                  // 1+(1<<14)+(1<<28)+(1<<42)
            uint64_t x = *data++;
            countsA += ((x & 0x5555) * magic) & mask_01; // 0101010101010101
            countsB += (((x >> 1) & 0x5555) * magic) & mask_01;
        } while (--tail);

        // transpose then store counters
        flag_counts[0]  += countsA & 0xFF;
        flag_counts[8]  += (countsA >>  8) & 0xFF;
        flag_counts[2]  += (countsA >> 16) & 0xFF;
        flag_counts[10] += (countsA >> 24) & 0xFF;
        flag_counts[4]  += (countsA >> 32) & 0xFF;
        flag_counts[12] += (countsA >> 40) & 0xFF;
        flag_counts[6]  += (countsA >> 48) & 0xFF;
        flag_counts[14] += (countsA >> 56) & 0xFF;
        flag_counts[1]  += countsB & 0xFF;
        flag_counts[9]  += (countsB >>  8) & 0xFF;
        flag_counts[3]  += (countsB >> 16) & 0xFF;
        flag_counts[11] += (countsB >> 24) & 0xFF;
        flag_counts[5]  += (countsB >> 32) & 0xFF;
        flag_counts[13] += (countsB >> 40) & 0xFF;
        flag_counts[7]  += (countsB >> 48) & 0xFF;
        flag_counts[15] += (countsB >> 56) & 0xFF;
    }

    return 0;
}